

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * mult(Bigint *a,Bigint *b)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Bigint *pBVar5;
  ULong *pUVar6;
  ULong *pUVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  Bigint *pBVar13;
  
  pBVar13 = a;
  if (a->wds < b->wds) {
    pBVar13 = b;
    b = a;
  }
  iVar2 = pBVar13->wds;
  iVar3 = b->wds;
  uVar12 = (long)iVar2 + (long)iVar3;
  iVar11 = (int)uVar12;
  pBVar5 = Balloc((uint)(pBVar13->maxwds < iVar11) + pBVar13->k);
  pUVar7 = pBVar5->x;
  if (0 < iVar11) {
    pUVar6 = (ULong *)&pBVar5->field_0x1c;
    if (&pBVar5->field_0x1c < pBVar5->x + uVar12) {
      pUVar6 = pBVar5->x + uVar12;
    }
    memset(pUVar7,0,((long)pUVar6 + (-0x19 - (long)pBVar5) & 0xfffffffffffffffcU) + 4);
  }
  if (0 < iVar3) {
    pUVar6 = b->x;
    do {
      uVar4 = *pUVar6;
      if ((ulong)uVar4 != 0) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          puVar1 = (uint *)((long)pBVar13->x + lVar8);
          uVar10 = *(uint *)((long)pUVar7 + lVar8) + uVar9 + (ulong)*puVar1 * (ulong)uVar4;
          uVar9 = uVar10 >> 0x20;
          *(int *)((long)pUVar7 + lVar8) = (int)uVar10;
          lVar8 = lVar8 + 4;
        } while (puVar1 + 1 < pBVar13->x + iVar2);
        *(int *)((long)pUVar7 + lVar8) = (int)(uVar10 >> 0x20);
      }
      pUVar6 = pUVar6 + 1;
      pUVar7 = pUVar7 + 1;
    } while (pUVar6 < b->x + iVar3);
  }
  if (0 < iVar11) {
    pUVar7 = pBVar5->x + (uVar12 - 1);
    do {
      if (*pUVar7 != 0) goto LAB_00111275;
      iVar2 = (int)uVar12;
      pUVar7 = pUVar7 + -1;
      uVar12 = (ulong)(iVar2 - 1);
    } while (1 < iVar2);
    uVar12 = 0;
  }
LAB_00111275:
  pBVar5->wds = (int)uVar12;
  return pBVar5;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int k, wa, wb, wc;
	ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
	ULong y;
#ifdef ULLong
	ULLong carry, z;
#else
	ULong carry, z;
#ifdef Pack_32
	ULong z2;
#endif
#endif

	if (a->wds < b->wds) {
		c = a;
		a = b;
		b = c;
		}
	k = a->k;
	wa = a->wds;
	wb = b->wds;
	wc = wa + wb;
	if (wc > a->maxwds)
		k++;
	c = Balloc(k MTa);
	for(x = c->x, xa = x + wc; x < xa; x++)
		*x = 0;
	xa = a->x;
	xae = xa + wa;
	xb = b->x;
	xbe = xb + wb;
	xc0 = c->x;
#ifdef ULLong
	for(; xb < xbe; xc0++) {
		if ((y = *xb++)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * (ULLong)y + *xc + carry;
				carry = z >> 32;
				*xc++ = z & FFFFFFFF;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#else
#ifdef Pack_32
	for(; xb < xbe; xb++, xc0++) {
		if ((y = *xb & 0xffff)) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
				carry = z >> 16;
				z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
				carry = z2 >> 16;
				Storeinc(xc, z2, z);
				}
				while(x < xae);
			*xc = carry;
			}
		if ((y = *xb >> 16)) {
			x = xa;
			xc = xc0;
			carry = 0;
			z2 = *xc;
			do {
				z = (*x & 0xffff) * y + (*xc >> 16) + carry;
				carry = z >> 16;
				Storeinc(xc, z, z2);
				z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
				carry = z2 >> 16;
				}
				while(x < xae);
			*xc = z2;
			}
		}
#else
	for(; xb < xbe; xc0++) {
		if (y = *xb++) {
			x = xa;
			xc = xc0;
			carry = 0;
			do {
				z = *x++ * y + *xc + carry;
				carry = z >> 16;
				*xc++ = z & 0xffff;
				}
				while(x < xae);
			*xc = carry;
			}
		}
#endif
#endif
	for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
	c->wds = wc;
	return c;
	}